

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

bc_string_t * bc_string_append_escaped(bc_string_t *str,char *suffix)

{
  bool bVar1;
  long local_30;
  size_t i;
  _Bool escaped;
  char *suffix_local;
  bc_string_t *str_local;
  
  if (str == (bc_string_t *)0x0) {
    str_local = (bc_string_t *)0x0;
  }
  else {
    str_local = str;
    if (suffix != (char *)0x0) {
      bVar1 = false;
      suffix_local = (char *)str;
      for (local_30 = 0; suffix[local_30] != '\0'; local_30 = local_30 + 1) {
        if ((suffix[local_30] != '\\') || (bVar1)) {
          bVar1 = false;
          suffix_local = (char *)bc_string_append_c((bc_string_t *)suffix_local,suffix[local_30]);
        }
        else {
          bVar1 = true;
        }
      }
      str_local = (bc_string_t *)suffix_local;
    }
  }
  return str_local;
}

Assistant:

bc_string_t*
bc_string_append_escaped(bc_string_t *str, const char *suffix)
{
    if (str == NULL)
        return NULL;
    if (suffix == NULL)
        return str;
    bool escaped = false;
    for (size_t i = 0; suffix[i] != '\0'; i++) {
        if (suffix[i] == '\\' && !escaped) {
            escaped = true;
            continue;
        }
        escaped = false;
        str = bc_string_append_c(str, suffix[i]);
    }
    return str;
}